

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O0

shared_ptr<mnf::Manifold> mnf::Manifold::copyManifold(Manifold *m)

{
  shared_ptr<mnf::Manifold> sVar1;
  Manifold *m_local;
  shared_ptr<mnf::Manifold> *copy;
  
  sVar1 = getNewCopy(m);
  sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = m;
  return (shared_ptr<mnf::Manifold>)
         sVar1.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Manifold> Manifold::copyManifold(const Manifold& m)
{
  std::shared_ptr<Manifold> copy = m.getNewCopy();
  return copy;
}